

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEEE754PluginTest.cpp
# Opt level: O2

void __thiscall
TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test::testBody
          (TEST_FE_with_Plugin_should_not_fail_again_when_test_has_already_failed_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  size_t sVar4;
  TestTestingFixture *this_00;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture;
  TestTestingFixture::setTestFunction(this_00,set_everything_but_already_failed);
  TestTestingFixture::runAllTests(this_00);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = IEEE754ExceptionsPlugin::checkIeee754OverflowExceptionFlag();
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK",
             "IEEE754ExceptionsPlugin::checkIeee754OverflowExceptionFlag()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/IEEE754PluginTest.cpp"
             ,0x77,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = IEEE754ExceptionsPlugin::checkIeee754UnderflowExceptionFlag();
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK",
             "IEEE754ExceptionsPlugin::checkIeee754UnderflowExceptionFlag()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/IEEE754PluginTest.cpp"
             ,0x78,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = IEEE754ExceptionsPlugin::checkIeee754InexactExceptionFlag();
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK",
             "IEEE754ExceptionsPlugin::checkIeee754InexactExceptionFlag()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/IEEE754PluginTest.cpp"
             ,0x79,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = IEEE754ExceptionsPlugin::checkIeee754DivByZeroExceptionFlag();
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK",
             "IEEE754ExceptionsPlugin::checkIeee754DivByZeroExceptionFlag()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/IEEE754PluginTest.cpp"
             ,0x7a,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  sVar4 = TestTestingFixture::getCheckCount(this_00);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,1,sVar4,"LONGS_EQUAL(1, fixture.getCheckCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/IEEE754PluginTest.cpp"
             ,0x7b,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  sVar4 = TestTestingFixture::getFailureCount(this_00);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,1,sVar4,"LONGS_EQUAL(1, fixture.getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/IEEE754PluginTest.cpp"
             ,0x7c,pTVar3);
  return;
}

Assistant:

TEST(FE_with_Plugin, should_not_fail_again_when_test_has_already_failed)
{
    fixture.setTestFunction(set_everything_but_already_failed);
    fixture.runAllTests();
    CHECK(IEEE754ExceptionsPlugin::checkIeee754OverflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754UnderflowExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754InexactExceptionFlag());
    CHECK(IEEE754ExceptionsPlugin::checkIeee754DivByZeroExceptionFlag());
    LONGS_EQUAL(1, fixture.getCheckCount());
    LONGS_EQUAL(1, fixture.getFailureCount());
}